

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<long_double>::AutoFill
          (TPZBlockDiagonal<long_double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long *plVar4;
  int *piVar5;
  long lVar6;
  longdouble *plVar7;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar8;
  longdouble in_ST6;
  longdouble lVar9;
  double __x;
  double __x_00;
  double __x_01;
  longdouble val;
  type_conflict2 sum;
  int64_t c;
  int64_t r;
  int64_t nb;
  int64_t pos;
  int64_t eq;
  int64_t bsize;
  int64_t b;
  int64_t blsize;
  int64_t totalsize;
  TPZStack<int,_10> blsizes;
  size_t in_stack_00000268;
  char *in_stack_00000270;
  int in_stack_fffffffffffffe4c;
  undefined2 in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe52;
  undefined4 local_1a4;
  undefined6 in_stack_fffffffffffffe60;
  undefined6 uVar10;
  undefined2 in_stack_fffffffffffffe66;
  TPZMatrix<long_double> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar11;
  undefined6 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed6;
  long local_100;
  longdouble local_d8;
  long local_c0;
  long local_b8;
  int64_t local_90;
  long local_70;
  
  if (in_RSI != in_RDX) {
    pzinternal::DebugStopImpl(in_stack_00000270,in_stack_00000268);
  }
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
  for (local_70 = 0; local_70 < in_RSI; local_70 = local_100 + local_70) {
    iVar2 = rand();
    local_100 = (in_RSI * iVar2) / 0x7fffffff;
    if (in_RSI - local_70 <= local_100) {
      local_100 = in_RSI - local_70;
    }
    TPZStack<int,_10>::Push
              ((TPZStack<int,_10> *)CONCAT62(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
  }
  Initialize((TPZBlockDiagonal<long_double> *)
             CONCAT26(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0),
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
  for (local_90 = 0; local_90 < iVar3; local_90 = local_90 + 1) {
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_90);
    lVar1 = *plVar4;
    piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_90);
    lVar6 = (long)*piVar5;
    for (local_c0 = 0; local_c0 < lVar6; local_c0 = local_c0 + 1) {
      local_d8 = (longdouble)0;
      local_b8 = 0;
      lVar8 = in_ST6;
      if (in_ECX == 1) {
        for (local_b8 = 0; lVar8 = in_ST6, local_b8 < local_c0; local_b8 = local_b8 + 1) {
          plVar7 = TPZVec<long_double>::operator[]
                             ((TPZVec<long_double> *)(in_RDI + 0x20),
                              lVar1 + local_b8 + local_c0 * lVar6);
          uVar11 = SUB104(*plVar7,0);
          uVar10 = (undefined6)((unkuint10)*plVar7 >> 0x20);
          plVar7 = TPZVec<long_double>::operator[]
                             ((TPZVec<long_double> *)(in_RDI + 0x20),
                              lVar1 + local_c0 + local_b8 * lVar6);
          *plVar7 = (longdouble)CONCAT64(uVar10,uVar11);
          TPZVec<long_double>::operator[]
                    ((TPZVec<long_double> *)(in_RDI + 0x20),lVar1 + local_b8 + local_c0 * lVar6);
          std::fabs(__x);
          local_d8 = local_d8 + in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
        }
      }
      for (; local_b8 < lVar6; local_b8 = local_b8 + 1) {
        lVar9 = lVar8;
        TPZMatrix<long_double>::GetRandomVal(in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea0 =
             (TPZMatrix<long_double> *)
             TPZVec<long_double>::operator[]
                       ((TPZVec<long_double> *)(in_RDI + 0x20),lVar1 + local_c0 + local_b8 * lVar6);
        *(longdouble *)&in_stack_fffffffffffffea0->super_TPZBaseMatrix = in_ST0;
        in_ST0 = in_ST1;
        if (local_c0 != local_b8) {
          in_ST0 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar8;
          lVar8 = lVar9;
          std::fabs(__x_00);
          local_d8 = local_d8 + in_ST1;
          lVar9 = lVar8;
        }
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar8;
        lVar8 = lVar9;
      }
      TPZVec<long_double>::operator[]
                ((TPZVec<long_double> *)(in_RDI + 0x20),lVar1 + local_c0 + local_c0 * lVar6);
      std::fabs(__x_01);
      in_ST6 = lVar8;
      if (in_ST0 < local_d8) {
        local_1a4 = SUB104((longdouble)1 + local_d8,0);
        uVar10 = (undefined6)((unkuint10)((longdouble)1 + local_d8) >> 0x20);
        plVar7 = TPZVec<long_double>::operator[]
                           ((TPZVec<long_double> *)(in_RDI + 0x20),
                            lVar1 + local_c0 + local_c0 * lVar6);
        *plVar7 = (longdouble)CONCAT64(uVar10,local_1a4);
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar8;
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x11f146e);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}